

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRationalBezierCurve::IfcRationalBezierCurve
          (IfcRationalBezierCurve *this)

{
  IfcRationalBezierCurve *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xe8,"IfcRationalBezierCurve");
  IfcBezierCurve::IfcBezierCurve((IfcBezierCurve *)this,&PTR_construction_vtable_24__00ec4310);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>,
             &PTR_construction_vtable_24__00ec4448);
  *(undefined8 *)this = 0xec41e0;
  *(undefined8 *)&this->field_0xe8 = 0xec42f8;
  *(undefined8 *)&this->field_0x10 = 0xec4208;
  *(undefined8 *)&this->field_0x20 = 0xec4230;
  *(undefined8 *)&this->field_0x30 = 0xec4258;
  *(undefined8 *)&this->field_0x40 = 0xec4280;
  *(undefined8 *)&this->field_0xb0 = 0xec42a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0xec42d0;
  STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_0UL> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
              field_0x10);
  return;
}

Assistant:

IfcRationalBezierCurve() : Object("IfcRationalBezierCurve") {}